

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

real __thiscall
fasttext::ProductQuantizer::mulcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  uint uVar5;
  pointer pfVar6;
  ulong uVar7;
  int iVar8;
  undefined1 auVar9 [64];
  
  iVar1 = this->nsubq_;
  if ((long)iVar1 < 1) {
    auVar9 = ZEXT864(0);
  }
  else {
    uVar2 = this->dsub_;
    pfVar6 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar9 = ZEXT864(0);
    uVar4 = 0;
    uVar5 = uVar2;
    do {
      iVar8 = (int)uVar4 * this->ksub_;
      if (uVar4 == iVar1 - 1) {
        iVar8 = iVar8 * uVar2 + (uint)codes[uVar4 + (long)(t * iVar1)] * this->lastdsub_;
        uVar5 = this->lastdsub_;
      }
      else {
        iVar8 = (iVar8 + (uint)codes[uVar4 + (long)(t * iVar1)]) * uVar2;
      }
      if (0 < (int)uVar5) {
        uVar7 = 0;
        do {
          auVar3 = vfmadd231ss_fma(auVar9._0_16_,ZEXT416((uint)pfVar6[uVar7]),
                                   ZEXT416((uint)(this->centroids_).
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_start
                                                 [(long)iVar8 + uVar7]));
          auVar9 = ZEXT1664(auVar3);
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      uVar4 = uVar4 + 1;
      pfVar6 = pfVar6 + (int)uVar2;
    } while (uVar4 != (long)iVar1);
  }
  return auVar9._0_4_ * alpha;
}

Assistant:

real ProductQuantizer::mulcode(const Vector& x, const uint8_t* codes,
                               int32_t t, real alpha) const {
  real res = 0.0;
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {d = lastdsub_;}
    for(auto n = 0; n < d; n++) {
      res += x[m * dsub_ + n] * c[n];
    }
  }
  return res * alpha;
}